

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O2

int zip_entry_fread(zip_t *zip,char *filename)

{
  long lVar1;
  mz_bool mVar2;
  int iVar3;
  mz_uint file_index;
  mz_zip_archive_file_stat info;
  
  if (zip == (zip_t *)0x0) {
    iVar3 = -1;
  }
  else {
    memset(&info,0,0x458);
    iVar3 = -3;
    if (((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING) &&
       (lVar1 = (zip->entry).index, -1 < lVar1)) {
      file_index = (mz_uint)lVar1;
      mVar2 = mz_zip_reader_is_file_a_directory(&zip->archive,file_index);
      if (mVar2 == 0) {
        mVar2 = mz_zip_reader_extract_to_file(&zip->archive,file_index,filename,0);
        iVar3 = -0x13;
        if ((mVar2 != 0) &&
           (mVar2 = mz_zip_reader_file_stat(&zip->archive,file_index,&info), mVar2 != 0)) {
          if ((info.m_external_attr < 0x10000) ||
             (iVar3 = chmod(filename,info.m_external_attr >> 0x10), -1 < iVar3)) {
            iVar3 = 0;
          }
          else {
            iVar3 = -0x14;
          }
        }
      }
      else {
        iVar3 = -0x11;
      }
    }
  }
  return iVar3;
}

Assistant:

int zip_entry_fread(struct zip_t *zip, const char *filename) {
  mz_zip_archive *pzip = NULL;
  mz_uint idx;
  mz_uint32 xattr = 0;
  mz_zip_archive_file_stat info;

  if (!zip) {
    // zip_t handler is not initialized
    return ZIP_ENOINIT;
  }

  memset((void *)&info, 0, sizeof(mz_zip_archive_file_stat));
  pzip = &(zip->archive);
  if (pzip->m_zip_mode != MZ_ZIP_MODE_READING ||
      zip->entry.index < (ssize_t)0) {
    // the entry is not found or we do not have read access
    return ZIP_ENOENT;
  }

  idx = (mz_uint)zip->entry.index;
  if (mz_zip_reader_is_file_a_directory(pzip, idx)) {
    // the entry is a directory
    return ZIP_EINVENTTYPE;
  }

  if (!mz_zip_reader_extract_to_file(pzip, idx, filename, 0)) {
    return ZIP_ENOFILE;
  }

#if defined(_MSC_VER) || defined(PS4)
  (void)xattr; // unused
#else
  if (!mz_zip_reader_file_stat(pzip, idx, &info)) {
    // Cannot get information about zip archive;
    return ZIP_ENOFILE;
  }

  xattr = (info.m_external_attr >> 16) & 0xFFFF;
  if (xattr > 0 && xattr <= MZ_UINT16_MAX) {
    if (CHMOD(filename, (mode_t)xattr) < 0) {
      return ZIP_ENOPERM;
    }
  }
#endif

  return 0;
}